

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

bool __thiscall Catch::AssertionHandler::allowThrows(AssertionHandler *this)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  AssertionHandler *this_local;
  
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[4])();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[2])();
  return (bool)((byte)iVar1 & 1);
}

Assistant:

auto AssertionHandler::allowThrows() const -> bool {
        return getCurrentContext().getConfig()->allowThrows();
    }